

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapping.c
# Opt level: O3

void memory_mapping_list_add_merge_sorted_x86_64
               (MemoryMappingList *list,hwaddr phys_addr,hwaddr virt_addr,ram_addr_t length)

{
  MemoryMapping *pMVar1;
  ulong uVar2;
  MemoryMapping *pMVar3;
  ram_addr_t rVar4;
  ulong uVar5;
  
  pMVar3 = (list->head).tqh_first;
  if (pMVar3 != (MemoryMapping *)0x0) {
    pMVar1 = list->last_mapping;
    if (((pMVar1 != (MemoryMapping *)0x0) &&
        (rVar4 = pMVar1->length, pMVar1->phys_addr + rVar4 == phys_addr)) &&
       (pMVar1->virt_addr + rVar4 == virt_addr)) {
      pMVar1->length = rVar4 + length;
      return;
    }
    do {
      uVar2 = pMVar3->phys_addr;
      rVar4 = pMVar3->length;
      if ((rVar4 + uVar2 == phys_addr) && (pMVar3->virt_addr + rVar4 == virt_addr)) {
        pMVar3->length = rVar4 + length;
LAB_00546382:
        list->last_mapping = pMVar3;
        return;
      }
      if (length + phys_addr < uVar2) break;
      if ((phys_addr < rVar4 + uVar2) &&
         (uVar5 = pMVar3->virt_addr, virt_addr - uVar5 == phys_addr - uVar2)) {
        if (virt_addr <= uVar5 && uVar5 - virt_addr != 0) {
          rVar4 = rVar4 + (uVar5 - virt_addr);
          pMVar3->length = rVar4;
          pMVar3->virt_addr = virt_addr;
          uVar5 = virt_addr;
        }
        if (rVar4 + uVar5 < length + virt_addr) {
          pMVar3->length = (length + virt_addr) - uVar5;
        }
        goto LAB_00546382;
      }
      pMVar3 = (pMVar3->next).tqe_next;
    } while (pMVar3 != (MemoryMapping *)0x0);
  }
  create_new_memory_mapping(list,phys_addr,virt_addr,length);
  return;
}

Assistant:

void memory_mapping_list_add_merge_sorted(MemoryMappingList *list,
                                          hwaddr phys_addr,
                                          hwaddr virt_addr,
                                          ram_addr_t length)
{
    MemoryMapping *memory_mapping, *last_mapping;

    if (QTAILQ_EMPTY(&list->head)) {
        create_new_memory_mapping(list, phys_addr, virt_addr, length);
        return;
    }

    last_mapping = list->last_mapping;
    if (last_mapping) {
        if (mapping_contiguous(last_mapping, phys_addr, virt_addr)) {
            last_mapping->length += length;
            return;
        }
    }

    QTAILQ_FOREACH(memory_mapping, &list->head, next) {
        if (mapping_contiguous(memory_mapping, phys_addr, virt_addr)) {
            memory_mapping->length += length;
            list->last_mapping = memory_mapping;
            return;
        }

        if (phys_addr + length < memory_mapping->phys_addr) {
            /* create a new region before memory_mapping */
            break;
        }

        if (mapping_have_same_region(memory_mapping, phys_addr, length)) {
            if (mapping_conflict(memory_mapping, phys_addr, virt_addr)) {
                continue;
            }

            /* merge this region into memory_mapping */
            mapping_merge(memory_mapping, virt_addr, length);
            list->last_mapping = memory_mapping;
            return;
        }
    }

    /* this region can not be merged into any existed memory mapping. */
    create_new_memory_mapping(list, phys_addr, virt_addr, length);
}